

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O0

int RefSol(sunrealtype tf,N_Vector yref,int nout)

{
  undefined8 uVar1;
  int iVar2;
  FILE *pFVar3;
  int in_ESI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  sunrealtype tol;
  sunrealtype thd;
  sunrealtype th;
  sunrealtype t;
  sunrealtype tout;
  sunrealtype dtout;
  int out;
  int retval;
  SUNLinearSolver LS;
  SUNMatrix A;
  sunrealtype *yydata;
  N_Vector yy;
  void *cvode_mem;
  FILE *FID;
  int in_stack_fffffffffffffefc;
  char *in_stack_ffffffffffffff00;
  void *in_stack_ffffffffffffff08;
  double dVar8;
  undefined8 local_70;
  double local_68;
  double local_60;
  int local_58;
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  double *local_40;
  undefined8 local_38;
  undefined8 local_30;
  FILE *local_28;
  int local_1c;
  undefined8 local_18;
  double local_10;
  int local_4;
  
  local_28 = (FILE *)0x0;
  local_30 = 0;
  local_38 = 0;
  local_40 = (double *)0x0;
  local_48 = 0;
  local_50 = 0;
  local_1c = in_ESI;
  local_18 = in_RDI;
  local_10 = in_XMM0_Qa;
  local_38 = N_VNew_Serial(2,sunctx);
  iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc
                      );
  if (iVar2 == 0) {
    local_40 = (double *)N_VGetArrayPointer(local_38);
    *local_40 = 0.0;
    local_40[1] = 0.0;
    local_30 = CVodeCreate(2,sunctx);
    iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                         in_stack_fffffffffffffefc);
    if (iVar2 == 0) {
      local_54 = CVodeInit(local_30,fref,local_38);
      iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffefc);
      if (iVar2 == 0) {
        local_54 = CVodeSStolerances(0x3d06849b86a12b9b,0x3d06849b86a12b9b,local_30);
        iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffefc);
        if (iVar2 == 0) {
          local_48 = SUNDenseMatrix(2,2,sunctx);
          iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                               in_stack_fffffffffffffefc);
          if (iVar2 == 0) {
            local_50 = SUNLinSol_Dense(local_38,local_48,sunctx);
            iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                 in_stack_fffffffffffffefc);
            if (iVar2 == 0) {
              local_54 = CVodeSetLinearSolver(local_30,local_50,local_48);
              iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                   in_stack_fffffffffffffefc);
              if (iVar2 == 0) {
                local_54 = CVodeSetMaxNumSteps(local_30,100000);
                iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                     in_stack_fffffffffffffefc);
                if (iVar2 == 0) {
                  local_54 = CVodeSetStopTime(local_10,local_30);
                  iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                       in_stack_fffffffffffffefc);
                  if (iVar2 == 0) {
                    pFVar3 = fopen("cvsPendulum_dns_ref.txt","w");
                    dVar7 = *local_40;
                    local_28 = pFVar3;
                    cos(dVar7);
                    sin(dVar7);
                    sin(dVar7);
                    cos(dVar7);
                    fprintf(pFVar3,"%24.16e %24.16e %24.16e %24.16e %24.16e\n");
                    local_68 = local_10 / (double)local_1c;
                    local_60 = local_68;
                    for (local_58 = 0; local_58 < local_1c; local_58 = local_58 + 1) {
                      local_54 = CVodeSetStopTime(local_68,local_30);
                      iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                           in_stack_fffffffffffffefc);
                      if (iVar2 != 0) {
                        N_VDestroy_Serial(local_38);
                        SUNMatDestroy(local_48);
                        SUNLinSolFree(local_50);
                        CVodeFree(&local_30);
                        fclose(local_28);
                        return local_54;
                      }
                      local_54 = CVode(local_10,local_30,local_38,&local_70,1);
                      iVar2 = check_retval(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                           in_stack_fffffffffffffefc);
                      pFVar3 = local_28;
                      uVar1 = local_70;
                      if (iVar2 != 0) {
                        N_VDestroy_Serial(local_38);
                        SUNMatDestroy(local_48);
                        SUNLinSolFree(local_50);
                        CVodeFree(&local_30);
                        fclose(local_28);
                        return local_54;
                      }
                      dVar7 = *local_40;
                      dVar8 = local_40[1];
                      dVar4 = cos(dVar7);
                      dVar5 = sin(dVar7);
                      dVar6 = sin(dVar7);
                      dVar7 = cos(dVar7);
                      fprintf(pFVar3,"%24.16e %24.16e %24.16e %24.16e %24.16e\n",uVar1,dVar4,dVar5,
                              -dVar8 * dVar6,dVar8 * dVar7);
                      if (local_58 < local_1c + -1) {
                        local_68 = local_60 + local_68;
                      }
                      else {
                        local_68 = local_10;
                      }
                    }
                    fclose(local_28);
                    dVar7 = *local_40;
                    dVar8 = local_40[1];
                    local_40 = (double *)N_VGetArrayPointer(local_18);
                    dVar4 = cos(dVar7);
                    *local_40 = dVar4;
                    dVar4 = sin(dVar7);
                    local_40[1] = dVar4;
                    dVar4 = -dVar8;
                    dVar5 = sin(dVar7);
                    local_40[2] = dVar4 * dVar5;
                    dVar7 = cos(dVar7);
                    local_40[3] = dVar8 * dVar7;
                    N_VDestroy_Serial(local_38);
                    SUNMatDestroy(local_48);
                    SUNLinSolFree(local_50);
                    CVodeFree(&local_30);
                    local_4 = 0;
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int RefSol(sunrealtype tf, N_Vector yref, int nout)
{
  FILE* FID           = NULL; /* output file     */
  void* cvode_mem     = NULL; /* CVODES memory   */
  N_Vector yy         = NULL; /* solution vector */
  sunrealtype* yydata = NULL; /* vector data     */
  SUNMatrix A         = NULL; /* Jacobian matrix */
  SUNLinearSolver LS  = NULL; /* linear solver   */

  int retval;                            /* reusable return flag  */
  int out;                               /* output counter        */
  sunrealtype dtout;                     /* output frequency      */
  sunrealtype tout;                      /* output time           */
  sunrealtype t;                         /* return time           */
  sunrealtype th, thd;                   /* theta and theta dot   */
  sunrealtype tol = SUN_RCONST(1.0e-14); /* integration tolerance */

  /* Create the solution vector */
  yy = N_VNew_Serial(2, sunctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (-1); }

  /* Set the initial condition */
  yydata = N_VGetArrayPointer(yy);

  yydata[0] = ZERO; /* theta  */
  yydata[1] = ZERO; /* theta' */

  /* Create CVODES memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODES */
  retval = CVodeInit(cvode_mem, fref, ZERO, yy);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Set integration tolerances */
  retval = CVodeSStolerances(cvode_mem, tol, tol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(2, 2, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODES */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set CVODES optional inputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  retval = CVodeSetStopTime(cvode_mem, tf);
  if (check_retval(&retval, "CVodeSetStopTime", 1)) { return (1); }

  /* Open output file */
  FID = fopen("cvsPendulum_dns_ref.txt", "w");

  /* Output initial condition */
  th  = yydata[0];
  thd = yydata[1];
  fprintf(FID,
          "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
          " %24.16" ESYM "\n",
          ZERO, COS(th), SIN(th), -thd * SIN(th), thd * COS(th));

  /* Integrate to tf and periodically output the solution */
  dtout = tf / nout;
  tout  = dtout;

  for (out = 0; out < nout; out++)
  {
    /* Set stop time (do not interpolate output) */
    retval = CVodeSetStopTime(cvode_mem, tout);
    if (check_retval(&retval, "CVodeSetStopTime", 1))
    {
      N_VDestroy_Serial(yy);
      SUNMatDestroy(A);
      SUNLinSolFree(LS);
      CVodeFree(&cvode_mem);
      fclose(FID);
      return (retval);
    }

    /* Integrate to tout */
    retval = CVode(cvode_mem, tf, yy, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1))
    {
      N_VDestroy_Serial(yy);
      SUNMatDestroy(A);
      SUNLinSolFree(LS);
      CVodeFree(&cvode_mem);
      fclose(FID);
      return (retval);
    }

    /* Write output */
    th  = yydata[0];
    thd = yydata[1];
    fprintf(FID,
            "%24.16" ESYM " %24.16" ESYM " %24.16" ESYM " %24.16" ESYM
            " %24.16" ESYM "\n",
            t, COS(th), SIN(th), -thd * SIN(th), thd * COS(th));

    /* Update output time */
    if (out < nout - 1) { tout += dtout; }
    else { tout = tf; }
  }

  /* Close output file */
  fclose(FID);

  /* Get solution components */
  th  = yydata[0];
  thd = yydata[1];

  /* Convert to Cartesian reference solution */
  yydata = N_VGetArrayPointer(yref);

  yydata[0] = COS(th);
  yydata[1] = SIN(th);
  yydata[2] = -thd * SIN(th);
  yydata[3] = thd * COS(th);

  /* Free memory */
  N_VDestroy_Serial(yy);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);

  return (0);
}